

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O2

void __thiscall FStringTable::FreeNonDehackedStrings(FStringTable *this)

{
  StringEntry *pSVar1;
  StringEntry *block;
  int i;
  long lVar2;
  StringEntry *pSVar3;
  
  for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 1) {
    pSVar1 = ((StringEntry *)(this->Buckets + lVar2))->Next;
    block = (StringEntry *)(this->Buckets + lVar2);
    while (pSVar3 = block, block = pSVar1, block != (StringEntry *)0x0) {
      pSVar1 = block->Next;
      if (block->PassNum != '\0') {
        pSVar3->Next = pSVar1;
        M_Free(block);
        block = pSVar3;
      }
    }
  }
  return;
}

Assistant:

void FStringTable::FreeNonDehackedStrings ()
{
	for (int i = 0; i < HASH_SIZE; ++i)
	{
		StringEntry *entry, *next, **pentry;

		for (pentry = &Buckets[i], entry = *pentry; entry != NULL; )
		{
			next = entry->Next;
			if (entry->PassNum != 0)
			{
				*pentry = next;
				M_Free (entry);
			}
			else
			{
				pentry = &entry->Next;
			}
			entry = next;
		}
	}
}